

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::applyOncePragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  SourceManager *this_00;
  ulong uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  SourceLocation SVar6;
  value_type *elements;
  ulong pos0;
  ulong hash;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  string_view sVar16;
  char *local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  ensurePragmaArgs(this,pragma,0);
  this_00 = this->sourceManager;
  SVar6 = Token::location(&(pragma->super_DirectiveSyntax).directive);
  sVar16 = SourceManager::getSourceText(this_00,(BufferID)(SVar6._0_4_ & 0xfffffff));
  local_60 = sVar16._M_str;
  if (sVar16._M_len != 0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_60;
    hash = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
    pos0 = hash >> ((byte)(this->includeOnceHeaders).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
                          .arrays.groups_size_index & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    uVar3 = (this->includeOnceHeaders).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
            .arrays.groups_size_mask;
    uVar7 = 0;
    uVar10 = pos0;
    do {
      pgVar1 = (this->includeOnceHeaders).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
               .arrays.groups_ + uVar10;
      local_58 = pgVar1->m[0].n;
      uStack_57 = pgVar1->m[1].n;
      uStack_56 = pgVar1->m[2].n;
      bStack_55 = pgVar1->m[3].n;
      uStack_54 = pgVar1->m[4].n;
      uStack_53 = pgVar1->m[5].n;
      uStack_52 = pgVar1->m[6].n;
      bStack_51 = pgVar1->m[7].n;
      uStack_50 = pgVar1->m[8].n;
      uStack_4f = pgVar1->m[9].n;
      uStack_4e = pgVar1->m[10].n;
      bStack_4d = pgVar1->m[0xb].n;
      uStack_4c = pgVar1->m[0xc].n;
      uStack_4b = pgVar1->m[0xd].n;
      uStack_4a = pgVar1->m[0xe].n;
      bStack_49 = pgVar1->m[0xf].n;
      uVar11 = (uchar)uVar2;
      auVar15[0] = -(local_58 == uVar11);
      uVar12 = (uchar)((uint)uVar2 >> 8);
      auVar15[1] = -(uStack_57 == uVar12);
      uVar13 = (uchar)((uint)uVar2 >> 0x10);
      auVar15[2] = -(uStack_56 == uVar13);
      bVar14 = (byte)((uint)uVar2 >> 0x18);
      auVar15[3] = -(bStack_55 == bVar14);
      auVar15[4] = -(uStack_54 == uVar11);
      auVar15[5] = -(uStack_53 == uVar12);
      auVar15[6] = -(uStack_52 == uVar13);
      auVar15[7] = -(bStack_51 == bVar14);
      auVar15[8] = -(uStack_50 == uVar11);
      auVar15[9] = -(uStack_4f == uVar12);
      auVar15[10] = -(uStack_4e == uVar13);
      auVar15[0xb] = -(bStack_4d == bVar14);
      auVar15[0xc] = -(uStack_4c == uVar11);
      auVar15[0xd] = -(uStack_4b == uVar12);
      auVar15[0xe] = -(uStack_4a == uVar13);
      auVar15[0xf] = -(bStack_49 == bVar14);
      for (uVar8 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe); uVar8 != 0;
          uVar8 = uVar8 - 1 & uVar8) {
        uVar4 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        if (local_60 ==
            (this->includeOnceHeaders).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
            .arrays.elements_[uVar10 * 0xf + (ulong)uVar4]) {
          return;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0) break;
      lVar9 = uVar10 + uVar7;
      uVar7 = uVar7 + 1;
      uVar10 = lVar9 + 1U & uVar3;
    } while (uVar7 <= uVar3);
    if ((this->includeOnceHeaders).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
        .size_ctrl.size <
        (this->includeOnceHeaders).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
      ::unchecked_emplace_at<char_const*>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
                  *)&this->includeOnceHeaders,pos0,hash,&local_60);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
      ::unchecked_emplace_with_rehash<char_const*>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_set_types<char_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<char_const*,void>,std::equal_to<char_const*>,std::allocator<char_const*>>
                  *)&this->includeOnceHeaders,hash,&local_60);
    }
  }
  return;
}

Assistant:

void Preprocessor::applyOncePragma(const PragmaDirectiveSyntax& pragma) {
    ensurePragmaArgs(pragma, 0);

    auto text = sourceManager.getSourceText(pragma.directive.location().buffer());
    if (!text.empty())
        includeOnceHeaders.emplace(text.data());
}